

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::bug53MoveCols(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ModelTest *pMVar4;
  qint32 local_c14;
  qsizetype local_c10;
  qint32 local_c04;
  qsizetype local_c00;
  QModelIndex local_bf8;
  QModelIndex local_be0;
  QModelIndex local_bc8;
  QModelIndex local_bb0;
  QModelIndex local_b98;
  qint32 local_b7c;
  qsizetype local_b78;
  qint32 local_b6c;
  qsizetype local_b68;
  QModelIndex local_b60;
  QModelIndex local_b48;
  QModelIndex local_b30;
  QModelIndex local_b18;
  QModelIndex local_b00;
  qint32 local_ae4;
  qsizetype local_ae0;
  qint32 local_ad4;
  qsizetype local_ad0;
  QModelIndex local_ac8;
  QModelIndex local_ab0;
  QModelIndex local_a98;
  QModelIndex local_a80;
  QModelIndex local_a68;
  QModelIndex local_a50;
  qint32 local_a34;
  qsizetype local_a30;
  qint32 local_a24;
  qsizetype local_a20;
  QModelIndex local_a18;
  QModelIndex local_a00;
  QModelIndex local_9e8;
  QModelIndex local_9d0;
  undefined1 local_9b8 [8];
  QSignalSpy proxy2ColumnsAboutToBeMovedSpy;
  QSignalSpy proxy2ColumnsMovedSpy;
  QSignalSpy proxy1ColumnsAboutToBeMovedSpy;
  QSignalSpy proxy1ColumnsMovedSpy;
  QSignalSpy proxy2ColumnsRemovedSpy;
  QSignalSpy proxy2ColumnsAboutToBeRemovedSpy;
  QSignalSpy proxy1ColumnsRemovedSpy;
  QSignalSpy proxy1ColumnsAboutToBeRemovedSpy;
  QSignalSpy proxy2ColumnsInsertedSpy;
  QSignalSpy proxy2ColumnsAboutToBeInsertedSpy;
  QSignalSpy proxy1ColumnsInsertedSpy;
  QSignalSpy proxy1ColumnsAboutToBeInsertedSpy;
  undefined1 local_3a0 [24];
  RootIndexProxyModel local_388 [8];
  RootIndexProxyModel proxyModel2;
  QModelIndex local_370;
  undefined1 local_358 [24];
  RootIndexProxyModel local_340 [8];
  RootIndexProxyModel proxyModel1;
  QLatin1Char local_323;
  QChar local_322;
  QVariant local_320;
  QModelIndex local_300;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [29];
  QLatin1Char local_2b3;
  QChar local_2b2;
  QVariant local_2b0;
  QModelIndex local_290;
  undefined1 local_278 [29];
  QLatin1Char local_25b;
  QChar local_25a;
  QVariant local_258;
  QModelIndex local_238;
  undefined1 local_220 [24];
  undefined1 local_208 [29];
  QLatin1Char local_1eb;
  QChar local_1ea;
  QVariant local_1e8;
  QModelIndex local_1c8;
  undefined1 local_1b0 [24];
  undefined1 local_198 [29];
  QLatin1Char local_17b;
  QChar local_17a;
  QVariant local_178;
  QModelIndex local_158;
  undefined1 local_140 [24];
  QModelIndex local_128;
  undefined1 local_110 [24];
  QModelIndex local_f8;
  QModelIndex local_e0;
  QModelIndex local_c8;
  undefined1 local_b0 [24];
  QModelIndex local_98;
  QModelIndex local_80;
  QModelIndex local_68;
  undefined4 local_50;
  QModelIndex local_40;
  GenericModel local_28 [8];
  GenericModel baseModel;
  tst_RootIndexProxyModel *this_local;
  
  GenericModel::GenericModel(local_28,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_40);
  bVar1 = QAbstractItemModel::insertColumn((QAbstractItemModel *)local_28,0,&local_40);
  bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0x27a);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    QModelIndex::QModelIndex(&local_68);
    bVar2 = GenericModel::insertRows((int)local_28,0,(QModelIndex *)0x2);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),"baseModel.insertRows(0, 2)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x27b);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      QModelIndex::QModelIndex(&local_98);
      GenericModel::index((int)&local_80,(int)local_28,(QModelIndex *)0x0);
      bVar1 = QAbstractItemModel::insertColumn((QAbstractItemModel *)local_28,0,&local_80);
      bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(0, 0))","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x27c);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        QModelIndex::QModelIndex(&local_c8);
        GenericModel::index((int)local_b0,(int)local_28,(QModelIndex *)0x0);
        bVar2 = GenericModel::insertRows((int)local_28,0,(QModelIndex *)0x2);
        bVar2 = QTest::qVerify((bool)(bVar2 & 1),"baseModel.insertRows(0, 2, baseModel.index(0, 0))"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x27d);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_f8);
          GenericModel::index((int)&local_e0,(int)local_28,(QModelIndex *)0x1);
          bVar1 = QAbstractItemModel::insertColumn((QAbstractItemModel *)local_28,0,&local_e0);
          bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(1, 0))","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                 ,0x27e);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_128);
            GenericModel::index((int)local_110,(int)local_28,(QModelIndex *)0x1);
            bVar2 = GenericModel::insertRows((int)local_28,0,(QModelIndex *)0x1);
            bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                   "baseModel.insertRows(0, 1, baseModel.index(1, 0))","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x27f);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_158);
              GenericModel::index((int)local_140,(int)local_28,(QModelIndex *)0x0);
              QLatin1Char::QLatin1Char(&local_17b,'A');
              QChar::QChar(&local_17a,local_17b);
              QVariant::QVariant(&local_178,(QChar *)(ulong)(ushort)local_17a.ucs);
              bVar2 = GenericModel::setData
                                ((QModelIndex *)local_28,(QVariant *)local_140,(int)&local_178);
              bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                     "baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char(\'A\')))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x280);
              QVariant::~QVariant(&local_178);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex(&local_1c8);
                GenericModel::index((int)local_1b0,(int)local_28,(QModelIndex *)0x0);
                GenericModel::index((int)local_198,(int)local_28,(QModelIndex *)0x0);
                QLatin1Char::QLatin1Char(&local_1eb,'C');
                QChar::QChar(&local_1ea,local_1eb);
                QVariant::QVariant(&local_1e8,(QChar *)(ulong)(ushort)local_1ea.ucs);
                bVar2 = GenericModel::setData
                                  ((QModelIndex *)local_28,(QVariant *)local_198,(int)&local_1e8);
                bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                       "baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'C\')))"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                       ,0x281);
                QVariant::~QVariant(&local_1e8);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  QModelIndex::QModelIndex(&local_238);
                  GenericModel::index((int)local_220,(int)local_28,(QModelIndex *)0x0);
                  GenericModel::index((int)local_208,(int)local_28,(QModelIndex *)0x1);
                  QLatin1Char::QLatin1Char(&local_25b,'D');
                  QChar::QChar(&local_25a,local_25b);
                  QVariant::QVariant(&local_258,(QChar *)(ulong)(ushort)local_25a.ucs);
                  bVar2 = GenericModel::setData
                                    ((QModelIndex *)local_28,(QVariant *)local_208,(int)&local_258);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'D\')))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                         ,0x282);
                  QVariant::~QVariant(&local_258);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_290);
                    GenericModel::index((int)local_278,(int)local_28,(QModelIndex *)0x1);
                    QLatin1Char::QLatin1Char(&local_2b3,'B');
                    QChar::QChar(&local_2b2,local_2b3);
                    QVariant::QVariant(&local_2b0,(QChar *)(ulong)(ushort)local_2b2.ucs);
                    bVar2 = GenericModel::setData
                                      ((QModelIndex *)local_28,(QVariant *)local_278,(int)&local_2b0
                                      );
                    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                           "baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char(\'B\')))"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x283);
                    QVariant::~QVariant(&local_2b0);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_300);
                      GenericModel::index((int)local_2e8,(int)local_28,(QModelIndex *)0x1);
                      GenericModel::index((int)local_2d0,(int)local_28,(QModelIndex *)0x0);
                      QLatin1Char::QLatin1Char(&local_323,'E');
                      QChar::QChar(&local_322,local_323);
                      QVariant::QVariant(&local_320,(QChar *)(ulong)(ushort)local_322.ucs);
                      bVar2 = GenericModel::setData
                                        ((QModelIndex *)local_28,(QVariant *)local_2d0,
                                         (int)&local_320);
                      bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                             "baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char(\'E\')))"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x284);
                      QVariant::~QVariant(&local_320);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        RootIndexProxyModel::RootIndexProxyModel(local_340,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)local_340,(QObject *)local_28);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_340);
                        QModelIndex::QModelIndex(&local_370);
                        GenericModel::index((int)local_358,(int)local_28,(QModelIndex *)0x0);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)local_340);
                        RootIndexProxyModel::RootIndexProxyModel(local_388,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)local_388,(QObject *)local_28);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_388);
                        QModelIndex::QModelIndex
                                  ((QModelIndex *)&proxy1ColumnsAboutToBeInsertedSpy.m_waiting);
                        GenericModel::index((int)local_3a0,(int)local_28,(QModelIndex *)0x1);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)local_388);
                        QSignalSpy::QSignalSpy
                                  ((QSignalSpy *)&proxy1ColumnsInsertedSpy.m_waiting,
                                   (QObject *)local_340,
                                   "2columnsAboutToBeInserted(QModelIndex, int, int)");
                        bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                    &proxy1ColumnsInsertedSpy.m_waiting);
                        bVar2 = QTest::qVerify(bVar1,"proxy1ColumnsAboutToBeInsertedSpy.isValid()",
                                               "",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                               ,0x28e);
                        if ((bVar2 & 1) == 0) {
                          local_50 = 1;
                        }
                        else {
                          QSignalSpy::QSignalSpy
                                    ((QSignalSpy *)&proxy2ColumnsAboutToBeInsertedSpy.m_waiting,
                                     (QObject *)local_340,"2columnsInserted(QModelIndex, int, int)")
                          ;
                          bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                      &proxy2ColumnsAboutToBeInsertedSpy.m_waiting);
                          bVar2 = QTest::qVerify(bVar1,"proxy1ColumnsInsertedSpy.isValid()","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                 ,0x290);
                          if ((bVar2 & 1) == 0) {
                            local_50 = 1;
                          }
                          else {
                            QSignalSpy::QSignalSpy
                                      ((QSignalSpy *)&proxy2ColumnsInsertedSpy.m_waiting,
                                       (QObject *)local_388,
                                       "2columnsAboutToBeInserted(QModelIndex, int, int)");
                            bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                        &proxy2ColumnsInsertedSpy.m_waiting);
                            bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x292);
                            if ((bVar2 & 1) == 0) {
                              local_50 = 1;
                            }
                            else {
                              QSignalSpy::QSignalSpy
                                        ((QSignalSpy *)&proxy1ColumnsAboutToBeRemovedSpy.m_waiting,
                                         (QObject *)local_388,
                                         "2columnsInserted(QModelIndex, int, int)");
                              bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                          &proxy1ColumnsAboutToBeRemovedSpy.
                                                           m_waiting);
                              bVar2 = QTest::qVerify(bVar1,"proxy2ColumnsInsertedSpy.isValid()","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x294);
                              if ((bVar2 & 1) == 0) {
                                local_50 = 1;
                              }
                              else {
                                QSignalSpy::QSignalSpy
                                          ((QSignalSpy *)&proxy1ColumnsRemovedSpy.m_waiting,
                                           (QObject *)local_340,
                                           "2columnsAboutToBeRemoved(QModelIndex, int, int)");
                                bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                            &proxy1ColumnsRemovedSpy.m_waiting);
                                bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x296);
                                if ((bVar2 & 1) == 0) {
                                  local_50 = 1;
                                }
                                else {
                                  QSignalSpy::QSignalSpy
                                            ((QSignalSpy *)
                                             &proxy2ColumnsAboutToBeRemovedSpy.m_waiting,
                                             (QObject *)local_340,
                                             "2columnsRemoved(QModelIndex, int, int)");
                                  bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                              &proxy2ColumnsAboutToBeRemovedSpy.
                                                               m_waiting);
                                  bVar2 = QTest::qVerify(bVar1,"proxy1ColumnsRemovedSpy.isValid()",
                                                         "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x298);
                                  if ((bVar2 & 1) == 0) {
                                    local_50 = 1;
                                  }
                                  else {
                                    QSignalSpy::QSignalSpy
                                              ((QSignalSpy *)&proxy2ColumnsRemovedSpy.m_waiting,
                                               (QObject *)local_388,
                                               "2columnsAboutToBeRemoved(QModelIndex, int, int)");
                                    bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                &proxy2ColumnsRemovedSpy.m_waiting);
                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29a);
                                    if ((bVar2 & 1) == 0) {
                                      local_50 = 1;
                                    }
                                    else {
                                      QSignalSpy::QSignalSpy
                                                ((QSignalSpy *)&proxy1ColumnsMovedSpy.m_waiting,
                                                 (QObject *)local_388,
                                                 "2columnsRemoved(QModelIndex, int, int)");
                                      bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                  &proxy1ColumnsMovedSpy.m_waiting);
                                      bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29c);
                                      if ((bVar2 & 1) == 0) {
                                        local_50 = 1;
                                      }
                                      else {
                                        QSignalSpy::QSignalSpy
                                                  ((QSignalSpy *)
                                                   &proxy1ColumnsAboutToBeMovedSpy.m_waiting,
                                                   (QObject *)local_340,
                                                                                                      
                                                  "2columnsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                        bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                    &proxy1ColumnsAboutToBeMovedSpy.
                                                                     m_waiting);
                                        bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x29e);
                                        if ((bVar2 & 1) == 0) {
                                          local_50 = 1;
                                        }
                                        else {
                                          QSignalSpy::QSignalSpy
                                                    ((QSignalSpy *)&proxy2ColumnsMovedSpy.m_waiting,
                                                     (QObject *)local_340,
                                                                                                          
                                                  "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                          bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                      &proxy2ColumnsMovedSpy.
                                                                       m_waiting);
                                          bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a0);
                                          if ((bVar2 & 1) == 0) {
                                            local_50 = 1;
                                          }
                                          else {
                                            QSignalSpy::QSignalSpy
                                                      ((QSignalSpy *)
                                                       &proxy2ColumnsAboutToBeMovedSpy.m_waiting,
                                                       (QObject *)local_388,
                                                                                                              
                                                  "2columnsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                            bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                        &
                                                  proxy2ColumnsAboutToBeMovedSpy.m_waiting);
                                            bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a2);
                                            if ((bVar2 & 1) == 0) {
                                              local_50 = 1;
                                            }
                                            else {
                                              QSignalSpy::QSignalSpy
                                                        ((QSignalSpy *)local_9b8,
                                                         (QObject *)local_388,
                                                                                                                  
                                                  "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                              bVar1 = QSignalSpy::isValid((QSignalSpy *)local_9b8);
                                              bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a4);
                                              if ((bVar2 & 1) == 0) {
                                                local_50 = 1;
                                              }
                                              else {
                                                QModelIndex::QModelIndex(&local_9e8);
                                                GenericModel::index((int)&local_9d0,(int)local_28,
                                                                    (QModelIndex *)0x0);
                                                bVar1 = QAbstractItemModel::insertColumn
                                                                  ((QAbstractItemModel *)local_28,1,
                                                                   &local_9d0);
                                                bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.insertColumn(1, baseModel.index(0, 0))"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a5);
                                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_a00);
                                                  iVar3 = RootIndexProxyModel::columnCount
                                                                    ((QModelIndex *)local_340);
                                                  bVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a6);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a18);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_388);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a7);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a8);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2a9);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2aa);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ab);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ac);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ad);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ae);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2af);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b0);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b1);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    local_a20 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  local_a24 = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_a20,&local_a24,
                                                                                                                                          
                                                  "proxy1ColumnsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b2);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_a30 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsInsertedSpy.field_0x8);
                                                  local_a34 = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_a30,&local_a34,
                                                                                                                                          
                                                  "proxy1ColumnsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b3);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsAboutToBeInsertedSpy.
                                                                field_0x8);
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsInsertedSpy.field_0x8);
                                                    QModelIndex::QModelIndex(&local_a68);
                                                    GenericModel::index((int)&local_a50,
                                                                        (int)local_28,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::QModelIndex(&local_a98);
                                                    GenericModel::index((int)&local_a80,
                                                                        (int)local_28,
                                                                        (QModelIndex *)0x0);
                                                    bVar1 = QAbstractItemModel::moveColumn
                                                                      ((QAbstractItemModel *)
                                                                       local_28,&local_a50,1,
                                                                       &local_a80,0);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(baseModel.index(0, 0), 1, baseModel.index(0, 0), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b7);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ab0);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_340);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ac8);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_388);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2b9);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    local_ad0 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsAboutToBeMovedSpy.field_0x8);
                                                  local_ad4 = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_ad0,&local_ad4,
                                                                                                                                          
                                                  "proxy1ColumnsAboutToBeMovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ba);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_ae0 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&proxy1ColumnsMovedSpy
                                                                               .field_0x8);
                                                    local_ae4 = 1;
                                                    bVar1 = QTest::qCompare<long_long,int>
                                                                      (&local_ae0,&local_ae4,
                                                                                                                                              
                                                  "proxy1ColumnsMovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,699);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,700);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2bd);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2be);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2bf);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c0);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c1);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c2);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c3);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c4);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c5);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsAboutToBeMovedSpy.
                                                                field_0x8);
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsMovedSpy.field_0x8);
                                                    QModelIndex::QModelIndex(&local_b18);
                                                    GenericModel::index((int)&local_b00,
                                                                        (int)local_28,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::QModelIndex(&local_b30);
                                                    bVar1 = QAbstractItemModel::moveColumn
                                                                      ((QAbstractItemModel *)
                                                                       local_28,&local_b00,0,
                                                                       &local_b30,0);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(baseModel.index(0, 0), 0, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2c9);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_b48);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_340);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel1.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ca);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_b60);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_388);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cb);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    local_b68 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  local_b6c = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_b68,&local_b6c,
                                                                                                                                          
                                                  "proxy1ColumnsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cc);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_b78 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsRemovedSpy.field_0x8);
                                                  local_b7c = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_b78,&local_b7c,
                                                                                                                                          
                                                  "proxy1ColumnsRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cd);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2ce);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2cf);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d0);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d1);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d2);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d3);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d4);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d5);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d6);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2d7);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsAboutToBeRemovedSpy.
                                                                field_0x8);
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1ColumnsRemovedSpy.field_0x8);
                                                    QModelIndex::QModelIndex(&local_b98);
                                                    QModelIndex::QModelIndex(&local_bc8);
                                                    GenericModel::index((int)&local_bb0,
                                                                        (int)local_28,
                                                                        (QModelIndex *)0x0);
                                                    bVar1 = QAbstractItemModel::moveColumn
                                                                      ((QAbstractItemModel *)
                                                                       local_28,&local_b98,0,
                                                                       &local_bb0,0);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumn(QModelIndex(), 0, baseModel.index(0, 1), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2db);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_be0);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_340);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.columnCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2dc);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_bf8);
                                                    iVar3 = RootIndexProxyModel::columnCount
                                                                      ((QModelIndex *)local_388);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2dd);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2de);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2df);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeMovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e0);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e1);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    local_c00 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  local_c04 = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_c00,&local_c04,
                                                                                                                                          
                                                  "proxy1ColumnsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e2);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_c10 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1ColumnsInsertedSpy.field_0x8);
                                                  local_c14 = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_c10,&local_c14,
                                                                                                                                          
                                                  "proxy1ColumnsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e3);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e4);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e5);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e6);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e7);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2ColumnsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e8);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2ColumnsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2ColumnsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x2e9);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_50 = 1;
                                                  }
                                                  else {
                                                    local_50 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_50 = 1;
                                                  }
                                                }
                                                else {
                                                  local_50 = 1;
                                                }
                                              }
                                              QSignalSpy::~QSignalSpy((QSignalSpy *)local_9b8);
                                            }
                                            QSignalSpy::~QSignalSpy
                                                      ((QSignalSpy *)
                                                       &proxy2ColumnsAboutToBeMovedSpy.m_waiting);
                                          }
                                          QSignalSpy::~QSignalSpy
                                                    ((QSignalSpy *)&proxy2ColumnsMovedSpy.m_waiting)
                                          ;
                                        }
                                        QSignalSpy::~QSignalSpy
                                                  ((QSignalSpy *)
                                                   &proxy1ColumnsAboutToBeMovedSpy.m_waiting);
                                      }
                                      QSignalSpy::~QSignalSpy
                                                ((QSignalSpy *)&proxy1ColumnsMovedSpy.m_waiting);
                                    }
                                    QSignalSpy::~QSignalSpy
                                              ((QSignalSpy *)&proxy2ColumnsRemovedSpy.m_waiting);
                                  }
                                  QSignalSpy::~QSignalSpy
                                            ((QSignalSpy *)
                                             &proxy2ColumnsAboutToBeRemovedSpy.m_waiting);
                                }
                                QSignalSpy::~QSignalSpy
                                          ((QSignalSpy *)&proxy1ColumnsRemovedSpy.m_waiting);
                              }
                              QSignalSpy::~QSignalSpy
                                        ((QSignalSpy *)&proxy1ColumnsAboutToBeRemovedSpy.m_waiting);
                            }
                            QSignalSpy::~QSignalSpy
                                      ((QSignalSpy *)&proxy2ColumnsInsertedSpy.m_waiting);
                          }
                          QSignalSpy::~QSignalSpy
                                    ((QSignalSpy *)&proxy2ColumnsAboutToBeInsertedSpy.m_waiting);
                        }
                        QSignalSpy::~QSignalSpy((QSignalSpy *)&proxy1ColumnsInsertedSpy.m_waiting);
                        RootIndexProxyModel::~RootIndexProxyModel(local_388);
                        RootIndexProxyModel::~RootIndexProxyModel(local_340);
                      }
                      else {
                        local_50 = 1;
                      }
                    }
                    else {
                      local_50 = 1;
                    }
                  }
                  else {
                    local_50 = 1;
                  }
                }
                else {
                  local_50 = 1;
                }
              }
              else {
                local_50 = 1;
              }
            }
            else {
              local_50 = 1;
            }
          }
          else {
            local_50 = 1;
          }
        }
        else {
          local_50 = 1;
        }
      }
      else {
        local_50 = 1;
      }
    }
    else {
      local_50 = 1;
    }
  }
  else {
    local_50 = 1;
  }
  GenericModel::~GenericModel(local_28);
  return;
}

Assistant:

void tst_RootIndexProxyModel::bug53MoveCols()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    GenericModel baseModel;
    QVERIFY(baseModel.insertColumn(0));
    QVERIFY(baseModel.insertRows(0, 2));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertRows(0, 2, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(1, 0)));
    QVERIFY(baseModel.insertRows(0, 1, baseModel.index(1, 0)));
    QVERIFY(baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char('A'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char('C'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char('D'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char('B'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char('E'))));
    RootIndexProxyModel proxyModel1;
    new ModelTest(&proxyModel1, &baseModel);
    proxyModel1.setSourceModel(&baseModel);
    proxyModel1.setRootIndex(baseModel.index(0, 0));
    RootIndexProxyModel proxyModel2;
    new ModelTest(&proxyModel2, &baseModel);
    proxyModel2.setSourceModel(&baseModel);
    proxyModel2.setRootIndex(baseModel.index(1, 0));
    QSignalSpy proxy1ColumnsAboutToBeInsertedSpy(&proxyModel1, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy1ColumnsInsertedSpy(&proxyModel1, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsInsertedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeInsertedSpy(&proxyModel2, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy2ColumnsInsertedSpy(&proxyModel2, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsInsertedSpy.isValid());
    QSignalSpy proxy1ColumnsAboutToBeRemovedSpy(&proxyModel1, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy1ColumnsRemovedSpy(&proxyModel1, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1ColumnsRemovedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeRemovedSpy(&proxyModel2, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy2ColumnsRemovedSpy(&proxyModel2, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2ColumnsRemovedSpy.isValid());
    QSignalSpy proxy1ColumnsMovedSpy(&proxyModel1, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1ColumnsMovedSpy.isValid());
    QSignalSpy proxy1ColumnsAboutToBeMovedSpy(&proxyModel1, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isValid());
    QSignalSpy proxy2ColumnsMovedSpy(&proxyModel2, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2ColumnsMovedSpy.isValid());
    QSignalSpy proxy2ColumnsAboutToBeMovedSpy(&proxyModel2, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isValid());
    QVERIFY(baseModel.insertColumn(1, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QCOMPARE(proxy1ColumnsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsInsertedSpy.count(), 1);
    proxy1ColumnsAboutToBeInsertedSpy.clear();
    proxy1ColumnsInsertedSpy.clear();

    QVERIFY(baseModel.moveColumn(baseModel.index(0, 0), 1, baseModel.index(0, 0), 0));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QCOMPARE(proxy1ColumnsAboutToBeMovedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsMovedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    proxy1ColumnsAboutToBeMovedSpy.clear();
    proxy1ColumnsMovedSpy.clear();

    QVERIFY(baseModel.moveColumn(baseModel.index(0, 0), 0, QModelIndex(), 0));
    QCOMPARE(proxyModel1.columnCount(), 1);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QCOMPARE(proxy1ColumnsAboutToBeRemovedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsRemovedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
    proxy1ColumnsAboutToBeRemovedSpy.clear();
    proxy1ColumnsRemovedSpy.clear();

    QVERIFY(baseModel.moveColumn(QModelIndex(), 0, baseModel.index(0, 1), 0));
    QCOMPARE(proxyModel1.columnCount(), 2);
    QCOMPARE(proxyModel2.columnCount(), 1);
    QVERIFY(proxy1ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsMovedSpy.isEmpty());
    QCOMPARE(proxy1ColumnsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1ColumnsInsertedSpy.count(), 1);
    QVERIFY(proxy2ColumnsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2ColumnsInsertedSpy.isEmpty());
    QVERIFY(proxy1ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1ColumnsRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2ColumnsRemovedSpy.isEmpty());
#else
    QSKIP("This test requires the GenericModel module");
#endif
}